

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O2

bool Fossilize::parse_bucket_variant_dependencies
               (Value *deps,
               vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
               *variant_deps)

{
  pointer pVVar1;
  ValueIterator this;
  ValueIterator pGVar2;
  Ch *pCVar3;
  long lVar4;
  bool bVar5;
  Ch *local_38;
  
  if ((deps->data_).f.flags == 4) {
    pVVar1 = (variant_deps->
             super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((variant_deps->
        super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
        )._M_impl.super__Vector_impl_data._M_finish != pVVar1) {
      (variant_deps->
      super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>
      )._M_impl.super__Vector_impl_data._M_finish = pVVar1;
    }
    this = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::Begin(deps);
    while( true ) {
      pGVar2 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::End(deps);
      bVar5 = this == pGVar2;
      if ((bVar5) ||
         ((undefined1  [16])((undefined1  [16])this->data_ & (undefined1  [16])0x400000000000000) ==
          (undefined1  [16])0x0)) break;
      pCVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(this);
      local_38 = pCVar3;
      for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 0x40) {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Fossilize::parse_bucket_variant_dependencies(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&,std::vector<Fossilize::VariantDependency,std::allocator<Fossilize::VariantDependency>>&)::$_0>
                ::operator()((_Iter_pred<Fossilize::parse_bucket_variant_dependencies(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&,std::vector<Fossilize::VariantDependency,std::allocator<Fossilize::VariantDependency>>&)::__0>
                              *)&local_38,(VariantDependencyMap *)(variant_dependency_map + lVar4));
        if (bVar5) goto LAB_0016eb66;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Fossilize::parse_bucket_variant_dependencies(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&,std::vector<Fossilize::VariantDependency,std::allocator<Fossilize::VariantDependency>>&)::$_0>
                ::operator()((_Iter_pred<Fossilize::parse_bucket_variant_dependencies(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&,std::vector<Fossilize::VariantDependency,std::allocator<Fossilize::VariantDependency>>&)::__0>
                              *)&local_38,
                             (VariantDependencyMap *)(variant_dependency_map + lVar4 + 0x10));
        if (bVar5) {
          if (lVar4 == 0x100) goto LAB_0016eb7f;
          lVar4 = lVar4 + 0x10;
          goto LAB_0016eb66;
        }
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Fossilize::parse_bucket_variant_dependencies(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&,std::vector<Fossilize::VariantDependency,std::allocator<Fossilize::VariantDependency>>&)::$_0>
                ::operator()((_Iter_pred<Fossilize::parse_bucket_variant_dependencies(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&,std::vector<Fossilize::VariantDependency,std::allocator<Fossilize::VariantDependency>>&)::__0>
                              *)&local_38,
                             (VariantDependencyMap *)(variant_dependency_map + lVar4 + 0x20));
        if (bVar5) {
          lVar4 = lVar4 + 0x20;
          goto LAB_0016eb66;
        }
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<Fossilize::parse_bucket_variant_dependencies(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&,std::vector<Fossilize::VariantDependency,std::allocator<Fossilize::VariantDependency>>&)::$_0>
                ::operator()((_Iter_pred<Fossilize::parse_bucket_variant_dependencies(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&,std::vector<Fossilize::VariantDependency,std::allocator<Fossilize::VariantDependency>>&)::__0>
                              *)&local_38,
                             (VariantDependencyMap *)(variant_dependency_map + lVar4 + 0x30));
        if (bVar5) {
          lVar4 = lVar4 + 0x30;
          goto LAB_0016eb66;
        }
      }
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<Fossilize::parse_bucket_variant_dependencies(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&,std::vector<Fossilize::VariantDependency,std::allocator<Fossilize::VariantDependency>>&)::$_0>
              ::operator()((_Iter_pred<Fossilize::parse_bucket_variant_dependencies(rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const&,std::vector<Fossilize::VariantDependency,std::allocator<Fossilize::VariantDependency>>&)::__0>
                            *)&local_38,(VariantDependencyMap *)(variant_dependency_map + 0x100));
      lVar4 = 0x100;
      if (bVar5) {
LAB_0016eb66:
        std::vector<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>::
        push_back(variant_deps,(value_type *)(variant_dependency_map + lVar4 + 8));
      }
      else {
LAB_0016eb7f:
        fprintf(_stderr,"Fossilize WARN: Couldn\'t find variant dependency for %s, ignoring.\n",
                pCVar3);
      }
      this = this + 1;
    }
  }
  else {
    fwrite("Fossilize ERROR: bucketVariantDependencies must be an array.\n",0x3d,1,_stderr);
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool parse_bucket_variant_dependencies(const Value &deps, std::vector<VariantDependency> &variant_deps)
{
	if (!deps.IsArray())
	{
		LOGE("bucketVariantDependencies must be an array.\n");
		return false;
	}

	variant_deps.clear();

	for (auto itr = deps.Begin(); itr != deps.End(); ++itr)
	{
		auto &elem = *itr;
		if (!elem.IsString())
			return false;

		const char *str = elem.GetString();

		auto find_itr = std::find_if(std::begin(variant_dependency_map), std::end(variant_dependency_map),
		                             [str](const VariantDependencyMap &m) { return strcmp(str, m.env) == 0; });
		if (find_itr != std::end(variant_dependency_map))
			variant_deps.push_back(find_itr->dep);
		else
			LOGW("Couldn't find variant dependency for %s, ignoring.\n", str);
	}

	return true;
}